

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O3

void __thiscall amrex::TagBox::tags(TagBox *this,Vector<int,_std::allocator<int>_> *ar,Box *tilebx)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  pointer piVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int Ltb [3];
  Long stride [3];
  int local_58 [4];
  long local_48 [4];
  
  local_48[0] = 1;
  lVar9 = (long)(((this->super_BaseFab<char>).domain.bigend.vect[0] -
                 (this->super_BaseFab<char>).domain.smallend.vect[0]) + 1);
  local_48[1] = lVar9;
  lVar10 = (((this->super_BaseFab<char>).domain.bigend.vect[1] -
            (this->super_BaseFab<char>).domain.smallend.vect[1]) + 1) * lVar9;
  local_48[2] = lVar10;
  local_58[0] = 1;
  local_58[1] = 1;
  local_58[2] = 1;
  lVar3 = 0;
  lVar8 = 0;
  do {
    iVar1 = *(int *)((long)(tilebx->smallend).vect + lVar3);
    *(int *)((long)local_58 + lVar3) = (*(int *)((long)(tilebx->bigend).vect + lVar3) - iVar1) + 1;
    lVar8 = lVar8 + (long)(iVar1 - *(int *)((long)(this->super_BaseFab<char>).domain.smallend.vect +
                                           lVar3)) * *(long *)((long)local_48 + lVar3 * 2);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  pcVar2 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  if (0 < (long)local_58[2]) {
    pcVar2 = pcVar2 + lVar8;
    piVar4 = (ar->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      if (0 < local_58[1]) {
        uVar6 = 0;
        pcVar5 = pcVar2;
        do {
          if (0 < local_58[0]) {
            lVar7 = 0;
            lVar8 = 0;
            do {
              if (piVar4[lVar8] != 0) {
                pcVar5[lVar8] = (char)piVar4[lVar8];
              }
              lVar8 = lVar8 + 1;
              lVar7 = lVar7 + -4;
            } while (local_58[0] != (int)lVar8);
            piVar4 = (pointer)((long)piVar4 - lVar7);
          }
          uVar6 = uVar6 + 1;
          pcVar5 = pcVar5 + lVar9;
        } while (uVar6 != (uint)local_58[1]);
      }
      lVar3 = lVar3 + 1;
      pcVar2 = pcVar2 + lVar10;
    } while (lVar3 != local_58[2]);
  }
  return;
}

Assistant:

void
TagBox::tags (const Vector<int>& ar, const Box& tilebx) noexcept
{
    auto dlen = length();
    int Lbx[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Lbx[idim] = dlen[idim];
    }

    Long stride[] = {1, Lbx[0], Long(Lbx[0])*Long(Lbx[1])};

    Long stb=0;
    int Ltb[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Ltb[idim] = tilebx.length(idim);
        stb += stride[idim] * (tilebx.smallEnd(idim) - domain.smallEnd(idim));
    }

    TagType* const p0   = dataPtr() + stb;  // +stb to the lower corner of tilebox
    const int*     iptr = ar.dataPtr();

    for (int k=0; k<Ltb[2]; k++) {
        for (int j=0; j<Ltb[1]; j++) {
            TagType* cptr = p0 + j*stride[1] + k*stride[2];
            for (int i=0; i<Ltb[0]; i++, cptr++, iptr++) {
                if (*iptr) *cptr = *iptr;
            }
        }
    }
}